

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O3

void __thiscall CEffects::PlayerSpawn(CEffects *this,vec2 Pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CParticle local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0x20;
  do {
    local_88.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_88.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_88.m_Rot = 0.0;
    local_88.m_Rotspeed = 0.0;
    local_88.m_Gravity = 0.0;
    local_88.m_Friction = 0.0;
    local_88.m_FlowAffected = 1.0;
    local_88.m_LifeSpan = 0.0;
    local_88.m_StartSize = 32.0;
    local_88.m_EndSize = 32.0;
    local_88.m_Color.field_0.x = 1.0;
    local_88.m_Color.field_1.y = 1.0;
    local_88.m_Color.field_2.z = 1.0;
    local_88.m_Color.field_3.w = 1.0;
    local_88.m_Spr = 6;
    local_88.m_Pos = Pos;
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    fVar5 = powf((float)iVar3 * 4.656613e-10,3.0);
    auVar6._0_4_ = (float)iVar1 * 4.656613e-10 + -0.5;
    auVar6._4_4_ = (float)iVar2 * 4.656613e-10 + -0.5;
    auVar6._8_8_ = 0;
    auVar7._0_4_ = SQRT(auVar6._0_4_ * auVar6._0_4_ + auVar6._4_4_ * auVar6._4_4_);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_8_ = 0;
    auVar6 = divps(auVar6,auVar7);
    local_88.m_Vel.field_1.y = fVar5 * 600.0 * auVar6._4_4_;
    local_88.m_Vel.field_0.x = fVar5 * 600.0 * auVar6._0_4_;
    iVar1 = rand();
    local_88.m_LifeSpan = (float)iVar1 * 4.656613e-10 * 0.3 + 0.3;
    iVar1 = rand();
    local_88.m_EndSize = 0.0;
    local_88.m_StartSize = (float)iVar1 * 4.656613e-10 * 32.0 + 64.0;
    iVar1 = rand();
    fVar5 = (float)iVar1 * 4.656613e-10 * 3.1415927;
    local_88.m_Rot = fVar5 + fVar5;
    iVar1 = rand();
    local_88.m_Rotspeed = (float)iVar1 * 4.656613e-10;
    iVar1 = rand();
    local_88.m_Gravity = (float)iVar1 * 4.656613e-10 * -400.0;
    local_88.m_Friction = 0.7;
    local_88.m_Color.field_0.x = 0.70980394;
    local_88.m_Color.field_1.y = 0.3137255;
    local_88.m_Color.field_2.z = 0.79607844;
    local_88.m_Color.field_3.w = 1.0;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,2,&local_88);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  CSounds::PlayAt(((this->super_CComponent).m_pClient)->m_pSounds,2,0x11,1.0,Pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::PlayerSpawn(vec2 Pos)
{
	for(int i = 0; i < 32; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SHELL;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * (powf(random_float(), 3)*600.0f);
		p.m_LifeSpan = 0.3f + random_float()*0.3f;
		p.m_StartSize = 64.0f + random_float()*32;
		p.m_EndSize = 0;
		p.m_Rot = random_float()*pi*2;
		p.m_Rotspeed = random_float();
		p.m_Gravity = random_float()*-400.0f;
		p.m_Friction = 0.7f;
		p.m_Color = vec4(0xb5/255.0f, 0x50/255.0f, 0xcb/255.0f, 1.0f);
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);

	}
	m_pClient->m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_SPAWN, 1.0f, Pos);
}